

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZGeoLinear.h
# Opt level: O0

void pzgeom::TPZGeoLinear::X<Fad<double>>
               (TPZFMatrix<double> *nodes,TPZVec<Fad<double>_> *loc,TPZVec<Fad<double>_> *x)

{
  int64_t iVar1;
  TPZVec<Fad<double>_> *in_RDX;
  TPZVec<Fad<double>_> *in_RSI;
  TPZBaseMatrix *in_RDI;
  Fad<double> *extraout_XMM0_Qa;
  int i;
  int nrow;
  Fad<double> xi;
  Fad<double> *in_stack_fffffffffffffee0;
  Fad<double> *in_stack_fffffffffffffee8;
  Fad<double> *in_stack_fffffffffffffef0;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>_>_>
  *in_stack_fffffffffffffef8;
  Fad<double> *in_stack_ffffffffffffff00;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
  *in_stack_ffffffffffffff10;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
  *in_stack_ffffffffffffff18;
  Fad<double> *in_stack_ffffffffffffff20;
  double in_stack_ffffffffffffff28;
  double in_stack_ffffffffffffff30;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
  *in_stack_ffffffffffffff38;
  int local_40;
  
  TPZVec<Fad<double>_>::operator[](in_RSI,0);
  Fad<double>::Fad(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  iVar1 = TPZBaseMatrix::Rows(in_RDI);
  for (local_40 = 0; local_40 < (int)iVar1; local_40 = local_40 + 1) {
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_40,0);
    operator-<double,_Fad<double>,_nullptr>(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    operator*<double,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_nullptr>
              (in_stack_ffffffffffffff28,
               (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffff20);
    operator*<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_double,_nullptr>
              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_40,1);
    in_stack_fffffffffffffee0 = extraout_XMM0_Qa;
    operator+<double,_Fad<double>,_nullptr>(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    operator*<double,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_nullptr>
              (in_stack_ffffffffffffff28,
               (FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffff20);
    operator*<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    operator+<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>,_nullptr>
              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    TPZVec<Fad<double>_>::operator[](in_RDX,(long)local_40);
    Fad<double>::operator=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>_>_>
                *)in_stack_fffffffffffffee0);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffffee0);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffffee0);
    FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffffee0);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffffee0);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
                *)in_stack_fffffffffffffee0);
    FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffffee0);
  }
  Fad<double>::~Fad(in_stack_fffffffffffffee0);
  return;
}

Assistant:

inline void TPZGeoLinear::X(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc,TPZVec<T> &x){
        
        T xi = loc[0];
        int nrow = nodes.Rows();
        for(int i = 0; i < nrow; i++)
        {
            x[i] = nodes.GetVal(i,0)*(1.-xi)*0.5+nodes.GetVal(i,1)*(1.+xi)*0.5;
        }
        
    }